

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O3

reference __thiscall
OpenMesh::BaseKernel::property<OpenMesh::Attributes::StatusInfo>
          (BaseKernel *this,HPropHandleT<OpenMesh::Attributes::StatusInfo> _ph,HalfedgeHandle _hh)

{
  pointer pSVar1;
  PropertyT<OpenMesh::Attributes::StatusInfo> *pPVar2;
  
  pPVar2 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                     (&this->hprops_,
                      _ph.super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                      idx_);
  pSVar1 = (pPVar2->data_).
           super__Vector_base<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(long)(int)_hh.super_BaseHandle.idx_ <
      (ulong)((long)(pPVar2->data_).
                    super__Vector_base<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 2)) {
    return pSVar1 + (int)_hh.super_BaseHandle.idx_;
  }
  __assert_fail("size_t(_idx) < data_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Utils/Property.hh"
                ,0xbc,
                "reference OpenMesh::PropertyT<OpenMesh::Attributes::StatusInfo>::operator[](int) [T = OpenMesh::Attributes::StatusInfo]"
               );
}

Assistant:

typename HPropHandleT<T>::reference
  property(HPropHandleT<T> _ph, HalfedgeHandle _hh) {
    return hprops_.property(_ph)[_hh.idx()];
  }